

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_open_output_file_op(sexp ctx,sexp self,sexp_sint_t n,sexp path)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  sexp in_RCX;
  char *in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  int count;
  FILE *out;
  size_t *in_stack_000000f8;
  sexp_conflict in_stack_00000100;
  uint in_stack_ffffffffffffffc8;
  uint uVar3;
  int iVar4;
  sexp local_8;
  
  iVar4 = 0;
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 9)) {
    do {
      iVar1 = iVar4;
      if (iVar4 != 0) {
        sexp_gc(in_stack_00000100,in_stack_000000f8);
        iVar1 = iVar4;
      }
      __stream = fopen((((in_RCX->value).type.name)->value).flonum_bits + 8 +
                       (long)(in_RCX->value).type.cpl,"w");
      uVar3 = in_stack_ffffffffffffffc8 & 0xffffff;
      in_stack_ffffffffffffffc8 = uVar3;
      iVar4 = iVar1;
      if (__stream == (FILE *)0x0) {
        piVar2 = __errno_location();
        in_stack_ffffffffffffffc8 = uVar3 & 0xffffff;
        iVar4 = iVar1;
        if (*piVar2 == 0x18) {
          iVar4 = iVar1 + 1;
          in_stack_ffffffffffffffc8 = CONCAT13(iVar1 != 0,(int3)uVar3) ^ 0xff000000;
        }
      }
    } while ((in_stack_ffffffffffffffc8 & 0x1000000) != 0);
    if (__stream == (FILE *)0x0) {
      local_8 = sexp_file_exception(in_RDI,in_RSI,in_RDX,in_RCX);
    }
    else {
      iVar1 = fileno(__stream);
      fcntl(iVar1,4,0x800);
      local_8 = sexp_make_output_port
                          (in_RCX,(FILE *)__stream,(sexp)CONCAT44(iVar4,in_stack_ffffffffffffffc8));
    }
  }
  else {
    local_8 = sexp_type_exception(in_RDI,in_RSI,(sexp_uint_t)in_RDX,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_open_output_file_op (sexp ctx, sexp self, sexp_sint_t n, sexp path) {
  FILE *out;
  int count = 0;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, path);
  do {
    if (count != 0) sexp_gc(ctx, NULL);
    out = fopen(sexp_string_data(path), "w");
  } while (!out && sexp_out_of_file_descriptors() && !count++);
  if (!out)
    return sexp_file_exception(ctx, self, "couldn't open output file", path);
#if SEXP_USE_GREEN_THREADS
  fcntl(fileno(out), F_SETFL, O_NONBLOCK);
#endif
  return sexp_make_output_port(ctx, out, path);
}